

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

SN_ELEMENT * __thiscall
ON_SerialNumberMap::FindElementHelper(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  uint uVar1;
  uint uVar2;
  ON_SN_BLOCK *pOVar3;
  ON_SerialNumberMapPrivate *pOVar4;
  SN_ELEMENT *pSVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  SN_ELEMENT *pSVar9;
  ON_SN_BLOCK **ppOVar10;
  ulong uVar11;
  
  if ((sn <= this->m_private->m_maxsn) &&
     ((0xfffffffe < sn || (sn - 1 < this->m_private->m_lower_maxsn)))) {
    pOVar3 = this->m_sn_block0;
    if ((sn <= pOVar3->m_sn1) && (pOVar3->m_sn0 <= sn)) {
      this->m_e_blk = pOVar3;
      uVar1 = pOVar3->m_purged;
      uVar11 = (ulong)uVar1;
      if (pOVar3->m_sorted == 0) {
        if (uVar11 != 0) {
          if (this->m_bHashTableIsValid != '\0') {
            this->m_bHashTableIsValid = '\0';
          }
          this->m_sn_count = this->m_sn_count - uVar11;
          this->m_sn_purged = this->m_sn_purged - uVar11;
          ON_SN_BLOCK::CullBlockHelper(pOVar3);
          if (this->m_snblk_list_count == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = this->m_snblk_list[this->m_snblk_list_count - 1]->m_sn1;
          }
          uVar8 = this->m_sn_block0->m_sn1;
          if (uVar8 < uVar11) {
            uVar8 = uVar11;
          }
          pOVar4 = this->m_private;
          pOVar4->m_maxsn = uVar8;
          if (uVar8 < 0xffffffff) {
            pOVar4->m_lower_maxsn = uVar8;
          }
        }
        if (this->m_sn_block0->m_count != 0) {
          if (this->m_bHashTableIsValid != '\0') {
            this->m_bHashTableIsValid = '\0';
          }
          ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
        }
        pOVar3 = this->m_sn_block0;
        if (((sn <= pOVar3->m_sn1) && (pOVar3->m_sn0 <= sn)) && ((ulong)pOVar3->m_count != 0)) {
          pSVar5 = pOVar3->m_sn;
          uVar11 = (ulong)pOVar3->m_count;
          do {
            uVar8 = uVar11 >> 1;
            pSVar9 = pSVar5 + uVar8;
            if (pSVar5[uVar8].m_sn <= sn) {
              if (sn <= pSVar5[uVar8].m_sn) goto LAB_004d5442;
              pSVar5 = pSVar5 + uVar8 + 1;
              uVar8 = uVar11 - (uVar8 + 1);
            }
            uVar11 = uVar8;
          } while (uVar8 != 0);
        }
      }
      else {
        uVar2 = pOVar3->m_count;
        if (uVar2 >> (0xf < uVar1) * '\x03' + 1 < uVar1) {
          if (this->m_bHashTableIsValid != '\0') {
            this->m_bHashTableIsValid = '\0';
          }
          this->m_sn_count = this->m_sn_count - uVar11;
          this->m_sn_purged = this->m_sn_purged - uVar11;
          ON_SN_BLOCK::CullBlockHelper(pOVar3);
          if (this->m_snblk_list_count == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = this->m_snblk_list[this->m_snblk_list_count - 1]->m_sn1;
          }
          pOVar3 = this->m_sn_block0;
          uVar8 = pOVar3->m_sn1;
          if (uVar11 <= uVar8) {
            uVar11 = uVar8;
          }
          pOVar4 = this->m_private;
          pOVar4->m_maxsn = uVar11;
          if (uVar11 < 0xffffffff) {
            pOVar4->m_lower_maxsn = uVar11;
          }
          if (((sn <= uVar8) && (pOVar3->m_sn0 <= sn)) && ((ulong)pOVar3->m_count != 0)) {
            pSVar5 = pOVar3->m_sn;
            uVar11 = (ulong)pOVar3->m_count;
            do {
              uVar8 = uVar11 >> 1;
              pSVar9 = pSVar5 + uVar8;
              if (pSVar5[uVar8].m_sn <= sn) {
                if (sn <= pSVar5[uVar8].m_sn) goto LAB_004d5442;
                pSVar5 = pSVar5 + uVar8 + 1;
                uVar8 = uVar11 - (uVar8 + 1);
              }
              uVar11 = uVar8;
            } while (uVar8 != 0);
          }
        }
        else if ((ulong)uVar2 != 0) {
          pSVar5 = pOVar3->m_sn;
          uVar11 = (ulong)uVar2;
          do {
            uVar8 = uVar11 >> 1;
            pSVar9 = pSVar5 + uVar8;
            if (pSVar5[uVar8].m_sn <= sn) {
              if (sn <= pSVar5[uVar8].m_sn) goto LAB_004d5442;
              pSVar5 = pSVar5 + uVar8 + 1;
              uVar8 = uVar11 - (uVar8 + 1);
            }
            uVar11 = uVar8;
          } while (uVar8 != 0);
        }
      }
      pSVar9 = (SN_ELEMENT *)0x0;
LAB_004d5442:
      if (pSVar9 != (SN_ELEMENT *)0x0) {
        return pSVar9;
      }
    }
    if (this->m_snblk_list_count != 0) {
      ppOVar10 = this->m_snblk_list;
      uVar11 = this->m_snblk_list_count;
LAB_004d5477:
      do {
        uVar8 = uVar11 >> 1;
        pOVar3 = ppOVar10[uVar8];
        uVar1 = pOVar3->m_purged;
        if (pOVar3->m_count >> (0xf < uVar1) * '\x03' + 1 < uVar1) {
          if (this->m_bHashTableIsValid != '\0') {
            this->m_bHashTableIsValid = '\0';
          }
          this->m_sn_count = this->m_sn_count - (ulong)uVar1;
          this->m_sn_purged = this->m_sn_purged - (ulong)uVar1;
          ON_SN_BLOCK::CullBlockHelper(pOVar3);
          if (pOVar3->m_count == 0) {
            uVar6 = this->m_snblk_list_count;
            uVar8 = uVar8 + ((long)ppOVar10 - (long)this->m_snblk_list >> 3);
            while (uVar7 = uVar8 + 1, uVar7 < uVar6) {
              this->m_snblk_list[uVar8] = this->m_snblk_list[uVar7];
              uVar8 = uVar7;
            }
            this->m_snblk_list_count = uVar6 - 1;
            this->m_snblk_list[uVar6 - 1] = pOVar3;
            if (uVar6 - 1 == 0) {
              uVar8 = 0;
            }
            else {
              uVar8 = this->m_snblk_list[uVar6 - 2]->m_sn1;
            }
            uVar6 = this->m_sn_block0->m_sn1;
            if (uVar6 < uVar8) {
              uVar6 = uVar8;
            }
            pOVar4 = this->m_private;
            pOVar4->m_maxsn = uVar6;
            if (uVar6 < 0xffffffff) {
              pOVar4->m_lower_maxsn = uVar6;
            }
            uVar11 = uVar11 - 1;
            if (uVar11 == 0) {
              return (SN_ELEMENT *)0x0;
            }
            goto LAB_004d5477;
          }
          if (this->m_snblk_list_count == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = this->m_snblk_list[this->m_snblk_list_count - 1]->m_sn1;
          }
          uVar7 = this->m_sn_block0->m_sn1;
          if (uVar7 < uVar6) {
            uVar7 = uVar6;
          }
          pOVar4 = this->m_private;
          pOVar4->m_maxsn = uVar7;
          if (uVar7 < 0xffffffff) {
            pOVar4->m_lower_maxsn = uVar7;
          }
        }
        if (pOVar3->m_sn0 <= sn) {
          if (sn <= pOVar3->m_sn1) {
            this->m_e_blk = pOVar3;
            if ((ulong)pOVar3->m_count == 0) {
              return (SN_ELEMENT *)0x0;
            }
            pSVar5 = pOVar3->m_sn;
            uVar11 = (ulong)pOVar3->m_count;
            do {
              uVar8 = uVar11 >> 1;
              if (pSVar5[uVar8].m_sn <= sn) {
                if (sn <= pSVar5[uVar8].m_sn) {
                  return pSVar5 + uVar8;
                }
                pSVar5 = pSVar5 + uVar8 + 1;
                uVar8 = uVar11 - (uVar8 + 1);
              }
              uVar11 = uVar8;
            } while (uVar8 != 0);
            return (SN_ELEMENT *)0x0;
          }
          ppOVar10 = ppOVar10 + uVar8 + 1;
          uVar8 = uVar11 - (uVar8 + 1);
        }
        uVar11 = uVar8;
        if (uVar8 == 0) {
          return (SN_ELEMENT *)0x0;
        }
      } while( true );
    }
  }
  return (SN_ELEMENT *)0x0;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::FindElementHelper(ON__UINT64 sn)
{
  class ON_SN_BLOCK** eblk_array;
  class ON_SN_BLOCK* eblk;
  size_t i, j;

  if (m_private->MaxSn() < sn )
    return 0; // happens almost every time an object is added to the doc

  if (sn < UINT32_MAX && m_private->LowerMaxSn() < sn)
    return 0;

  if ( sn <= 0 )
    return 0;

  // First check m_sn_block0. For small models this
  // is the only place we need to look.
  if ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
  {
    SN_ELEMENT* e;

    m_e_blk = &m_sn_block0;
    if ( !m_sn_block0.m_sorted )
    {
      // m_sn_block0.m_sn[] needs to be sorted
      //
      // This is a rare occurrence.  It only happens
      // when commands add new objects in an order that
      // is different from that in which the CRhinoObject
      // class constructor was called.  In testing,
      // I could not find a real command that did this
      // and had to write TestAddBackwards to test this code.
      if ( m_sn_block0.m_purged > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        Internal_HashTableInvalidate();
        m_sn_count -= m_sn_block0.m_purged;
        m_sn_purged -= m_sn_block0.m_purged;
        m_sn_block0.CullBlockHelper();
        UpdateMaxSNHelper();
      }
      if ( m_sn_block0.m_count > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        Internal_HashTableInvalidate();
        m_sn_block0.SortBlockHelper();
      }
      e = ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
        ? m_sn_block0.BinarySearchBlockHelper(sn)
        : 0;
    }
    else if ( m_sn_block0.NeedsToBeCulled() )
    {
      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      Internal_HashTableInvalidate();
      m_sn_count -= m_sn_block0.m_purged;
      m_sn_purged -= m_sn_block0.m_purged;
      m_sn_block0.CullBlockHelper();
      UpdateMaxSNHelper();
      e = ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
        ? m_sn_block0.BinarySearchBlockHelper(sn)
        : 0;
    }
    else
    {
      e = m_sn_block0.BinarySearchBlockHelper(sn);
    }
    if (e)
      return e;
  }

  // look in the blocks kept in the m_sn_list[] array.
  // The m_sn[] arrays in these blocks are always sorted.
  // In addition the blocks are disjoint and stored in
  // the m_sn_list[] array in sorted order.
  if ( 0 == (i = (size_t)m_snblk_list_count) )
  {
    return 0;
  }
  eblk_array = m_snblk_list;
  while (i > 0 )
  {
    eblk = eblk_array[(j=i/2)];

    // The culling code is here rather than
    // in the binary search clause so the
    // entire ON_SerialNumberMap tends to
    // be tidy.
    if ( eblk->NeedsToBeCulled() )
    {
      // cull purged items from eblk

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      Internal_HashTableInvalidate();

      m_sn_count -= eblk->m_purged;
      m_sn_purged -= eblk->m_purged;
      eblk->CullBlockHelper();
      if ( 0 == eblk->m_count )
      {
        // put empty block at the end of the list
        for( j += ((eblk_array-m_snblk_list)+1); j < m_snblk_list_count; j++ )
        {
          m_snblk_list[j-1] = m_snblk_list[j];
        }
        m_snblk_list_count--;
        m_snblk_list[m_snblk_list_count] = eblk;
        i--;
        UpdateMaxSNHelper();
        continue;
      }
      UpdateMaxSNHelper();
    }

    if ( sn < eblk->m_sn0 )
    {
      i = j;
    }
    else if ( sn > eblk->m_sn1 )
    {
      j++;
      eblk_array += j;
      i -= j;
    }
    else 
    {
      m_e_blk = eblk;
      return eblk->BinarySearchBlockHelper(sn);
    }
  }

  return 0;
}